

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

int TeleportGetParameter(int stream,int index,float *value)

{
  int iVar1;
  SharedMemory *pSVar2;
  SharedMemoryHandle *pSVar3;
  
  pSVar3 = Teleport::GetSharedMemory();
  pSVar2 = pSVar3->data;
  *value = pSVar2->streams[stream].params[index].value;
  iVar1 = pSVar2->streams[stream].params[index].changed;
  pSVar2->streams[stream].params[index].changed = 0;
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetParameter(int stream, int index, float* value)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    *value = s.params[index].value;
    int changed = s.params[index].changed;
    s.params[index].changed = 0;
    return changed;
}